

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O1

void iCopyColors<cPalEntry,cBGRA,bOverwrite>
               (BYTE *pout,BYTE *pin,int count,int step,FCopyInfo *inf,BYTE tr,BYTE tg,BYTE tb)

{
  BYTE BVar1;
  byte bVar2;
  BYTE BVar3;
  byte bVar4;
  undefined2 uVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  long lVar9;
  FSpecialColormap *pFVar10;
  EBlend EVar11;
  long lVar12;
  ulong uVar13;
  int iVar14;
  BYTE *pBVar15;
  int iVar16;
  uint uVar17;
  long lVar18;
  
  pFVar10 = SpecialColormaps.Array;
  if (inf == (FCopyInfo *)0x0) {
    EVar11 = BLEND_NONE;
  }
  else {
    EVar11 = inf->blend;
  }
  switch(EVar11) {
  case BLEND_NONE:
    if (0 < count) {
      pBVar15 = pin + 3;
      lVar12 = 0;
      do {
        BVar3 = *pBVar15;
        pout[lVar12 * 4 + 2] = pBVar15[-1];
        pout[lVar12 * 4 + 1] = pBVar15[-2];
        pout[lVar12 * 4] = pBVar15[-3];
        pout[lVar12 * 4 + 3] = BVar3;
        lVar12 = lVar12 + 1;
        pBVar15 = pBVar15 + step;
      } while (count != (int)lVar12);
    }
    break;
  case BLEND_ICEMAP:
    if (0 < count) {
      pBVar15 = pin + 3;
      lVar12 = 0;
      do {
        BVar3 = *pBVar15;
        uVar17 = (uint)pBVar15[-2] * 0x8f + (uint)pBVar15[-1] * 0x4d +
                 ((uint)pBVar15[-3] + (uint)pBVar15[-3] * 8) * 4 >> 0xc;
        BVar1 = IcePalette[uVar17][1];
        pout[lVar12 * 4 + 2] = IcePalette[uVar17][0];
        pout[lVar12 * 4 + 1] = BVar1;
        pout[lVar12 * 4] = IcePalette[uVar17][2];
        pout[lVar12 * 4 + 3] = BVar3;
        lVar12 = lVar12 + 1;
        pBVar15 = pBVar15 + step;
      } while (count != (int)lVar12);
    }
    break;
  case BLEND_OVERLAY:
    if (0 < count) {
      pBVar15 = pin + 3;
      lVar12 = 0;
      do {
        BVar3 = *pBVar15;
        iVar16 = inf->blendcolor[3];
        bVar4 = pBVar15[-2];
        iVar14 = inf->blendcolor[1];
        bVar2 = pBVar15[-3];
        iVar6 = inf->blendcolor[2];
        pout[lVar12 * 4 + 2] = (BYTE)((uint)pBVar15[-1] * iVar16 + inf->blendcolor[0] >> 0x10);
        pout[lVar12 * 4 + 1] = (BYTE)((uint)bVar4 * iVar16 + iVar14 >> 0x10);
        pout[lVar12 * 4] = (BYTE)((uint)bVar2 * iVar16 + iVar6 >> 0x10);
        pout[lVar12 * 4 + 3] = BVar3;
        lVar12 = lVar12 + 1;
        pBVar15 = pBVar15 + step;
      } while (count != (int)lVar12);
    }
    break;
  case BLEND_MODULATE:
    if (0 < count) {
      pBVar15 = pin + 3;
      lVar12 = 0;
      do {
        BVar3 = *pBVar15;
        bVar4 = pBVar15[-2];
        iVar16 = inf->blendcolor[1];
        bVar2 = pBVar15[-3];
        iVar14 = inf->blendcolor[2];
        pout[lVar12 * 4 + 2] = (BYTE)((uint)pBVar15[-1] * inf->blendcolor[0] >> 0x10);
        pout[lVar12 * 4 + 1] = (BYTE)((uint)bVar4 * iVar16 >> 0x10);
        pout[lVar12 * 4] = (BYTE)((uint)bVar2 * iVar14 >> 0x10);
        pout[lVar12 * 4 + 3] = BVar3;
        lVar12 = lVar12 + 1;
        pBVar15 = pBVar15 + step;
      } while (count != (int)lVar12);
    }
    break;
  default:
    EVar11 = inf->blend;
    lVar12 = (long)EVar11;
    if (lVar12 < 0x21) {
      if ((BLEND_ICEMAP < EVar11) && (0 < count)) {
        iVar16 = 0x20 - EVar11;
        pBVar15 = pin + 3;
        lVar12 = 0;
        do {
          BVar3 = *pBVar15;
          bVar4 = pBVar15[-3];
          iVar14 = ((uint)pBVar15[-2] * 0x8f + (uint)pBVar15[-1] * 0x4d +
                    ((uint)bVar4 + (uint)bVar4 * 8) * 4 >> 8) * (EVar11 + BLEND_MODULATE);
          lVar18 = (long)(int)((uint)pBVar15[-1] * iVar16 + iVar14) * 0x84210843;
          lVar8 = (long)(int)((uint)pBVar15[-2] * iVar16 + iVar14) * 0x84210843;
          lVar9 = (long)(int)((uint)bVar4 * iVar16 + iVar14) * 0x84210843;
          pout[lVar12 * 4 + 2] = (char)(uint)((ulong)lVar18 >> 0x24) - (char)(lVar18 >> 0x3f);
          pout[lVar12 * 4 + 1] = (char)(uint)((ulong)lVar8 >> 0x24) - (char)(lVar8 >> 0x3f);
          pout[lVar12 * 4] = (char)(uint)((ulong)lVar9 >> 0x24) - (char)(lVar9 >> 0x3f);
          pout[lVar12 * 4 + 3] = BVar3;
          lVar12 = lVar12 + 1;
          pBVar15 = pBVar15 + step;
        } while (count != (int)lVar12);
      }
    }
    else if (0 < count) {
      pBVar15 = pin + 3;
      lVar18 = 0;
      do {
        uVar17 = (uint)pBVar15[-2] * 0x8f + (uint)pBVar15[-1] * 0x4d +
                 ((uint)pBVar15[-3] + (uint)pBVar15[-3] * 8) * 4;
        uVar7 = uVar17 >> 8;
        uVar13 = (ulong)uVar7;
        if (0xfe < uVar7) {
          uVar13 = 0xff;
        }
        BVar3 = *pBVar15;
        if (uVar17 < 0x100) {
          uVar13 = 0;
        }
        uVar5 = *(undefined2 *)((long)pFVar10 + uVar13 * 4 + lVar12 * 0x518 + -0xa700);
        pout[lVar18 * 4 + 2] = *(BYTE *)((long)pFVar10 + uVar13 * 4 + lVar12 * 0x518 + -0xa6fe);
        *(undefined2 *)(pout + lVar18 * 4) = uVar5;
        pout[lVar18 * 4 + 3] = BVar3;
        lVar18 = lVar18 + 1;
        pBVar15 = pBVar15 + step;
      } while (count != (int)lVar18);
    }
  }
  return;
}

Assistant:

void iCopyColors(BYTE *pout, const BYTE *pin, int count, int step, FCopyInfo *inf,
	BYTE tr, BYTE tg, BYTE tb)
{
	int i;
	int fac;
	BYTE r,g,b;
	int gray;
	int a;

	switch(inf? inf->blend : BLEND_NONE)
	{
	case BLEND_NONE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				TBlend::OpC(pout[TDest::RED], TSrc::R(pin), a, inf);
				TBlend::OpC(pout[TDest::GREEN], TSrc::G(pin), a, inf);
				TBlend::OpC(pout[TDest::BLUE], TSrc::B(pin), a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_ICEMAP:
		// Create the ice translation table, based on Hexen's.
		// Since this is done in True Color the purplish tint is fully preserved - even in Doom!
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				int gray = TSrc::Gray(pin)>>4;
	
				TBlend::OpC(pout[TDest::RED],   IcePalette[gray][0], a, inf);
				TBlend::OpC(pout[TDest::GREEN], IcePalette[gray][1], a, inf);
				TBlend::OpC(pout[TDest::BLUE],  IcePalette[gray][2], a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	default:

		if (inf->blend >= BLEND_SPECIALCOLORMAP1)
		{
			FSpecialColormap *cm = &SpecialColormaps[inf->blend - BLEND_SPECIALCOLORMAP1];
			for(i=0;i<count;i++)
			{
				a = TSrc::A(pin, tr, tg, tb);
				if (TBlend::ProcessAlpha0() || a)
				{
					gray = clamp<int>(TSrc::Gray(pin),0,255);

					PalEntry pe = cm->GrayscaleToColor[gray];
					TBlend::OpC(pout[TDest::RED], pe.r , a, inf);
					TBlend::OpC(pout[TDest::GREEN], pe.g, a, inf);
					TBlend::OpC(pout[TDest::BLUE], pe.b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		else if (inf->blend >= BLEND_DESATURATE1 && inf->blend<=BLEND_DESATURATE31)
		{
			// Desaturated light settings.
			fac=inf->blend-BLEND_DESATURATE1+1;
			for(i=0;i<count;i++)
			{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
				{
					gray = TSrc::Gray(pin);
					r = (TSrc::R(pin)*(31-fac) + gray*fac)/31;
					g = (TSrc::G(pin)*(31-fac) + gray*fac)/31;
					b = (TSrc::B(pin)*(31-fac) + gray*fac)/31;

					TBlend::OpC(pout[TDest::RED],   r, a, inf);
					TBlend::OpC(pout[TDest::GREEN], g, a, inf);
					TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
					TBlend::OpA(pout[TDest::ALPHA], a, inf);
				}
				pout+=4;
				pin+=step;
			}
		}
		break;

	case BLEND_MODULATE:
		for(i=0;i<count;i++)
		{
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[0])>>BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[1])>>BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[2])>>BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	case BLEND_OVERLAY:
		for(i=0;i<count;i++)
		{
			// color blend
			a = TSrc::A(pin, tr, tg, tb);
			if (TBlend::ProcessAlpha0() || a)
			{
				r = (TSrc::R(pin)*inf->blendcolor[3] + inf->blendcolor[0]) >> BLENDBITS;
				g = (TSrc::G(pin)*inf->blendcolor[3] + inf->blendcolor[1]) >> BLENDBITS;
				b = (TSrc::B(pin)*inf->blendcolor[3] + inf->blendcolor[2]) >> BLENDBITS;

				TBlend::OpC(pout[TDest::RED],   r, a, inf);
				TBlend::OpC(pout[TDest::GREEN], g, a, inf);
				TBlend::OpC(pout[TDest::BLUE],  b, a, inf);
				TBlend::OpA(pout[TDest::ALPHA], a, inf);
			}
			pout+=4;
			pin+=step;
		}
		break;

	}
}